

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test::
~TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test
          (TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterOfWrongType)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTesting actualObject(75646);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockNamedValue parameter("output");
    parameter.setConstObjectPointer("OtherTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo").withOutputParameterOfType("OtherTypeForTesting", "output", &actualObject);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}